

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

unique_ptr<double[],_std::default_delete<double[]>_> __thiscall
qclab::dense::init_unique_array<double>(dense *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong __n;
  double *__p;
  pointer pdVar2;
  unique_ptr<double[],_std::default_delete<double[]>_> local_20;
  unique_ptr<double[],_std::default_delete<double[]>_> mem;
  int64_t size_local;
  
  mem._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)size;
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = double]");
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  __n = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  __p = (double *)operator_new__(__n);
  memset(__p,0,__n);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<double*,std::default_delete<double[]>,void,bool>
            ((unique_ptr<double[],std::default_delete<double[]>> *)&local_20,__p);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&local_20);
  if (pdVar2 != (pointer)0x0) {
    std::unique_ptr<double[],_std::default_delete<double[]>_>::unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)this,&local_20);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_20);
    return (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)this;
  }
  __assert_fail("mem.get() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x20,"auto qclab::dense::init_unique_array(const int64_t) [T = double]");
}

Assistant:

inline auto init_unique_array( const int64_t size ) {
      assert( size > 0 ) ;
      std::unique_ptr< T[] > mem( new T[size]() ) ;
      assert( mem.get() != nullptr ) ;
      return mem ;
    }